

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O1

void __thiscall
libcellml::Validator::ValidatorImpl::validateVariableInterface
          (ValidatorImpl *this,VariablePtr *variable,VariableMap *alreadyReported)

{
  IssueImpl *pIVar1;
  shared_ptr<libcellml::VariablePair> *psVar2;
  EntityImpl *this_00;
  bool bVar3;
  InterfaceType interfaceTypeMinimumRequired;
  undefined8 *puVar4;
  size_t sVar5;
  long *plVar6;
  long lVar7;
  long *plVar8;
  element_type *peVar9;
  ulong *puVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  long lVar12;
  VariablePtr *variable_00;
  __normal_iterator<std::shared_ptr<libcellml::VariablePair>_*,_std::vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>_>
  __it;
  undefined8 uVar13;
  _Alloc_hider _Var14;
  ulong uVar15;
  __normal_iterator<std::shared_ptr<libcellml::VariablePair>_*,_std::vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>_>
  __it_00;
  string interfaceTypeString;
  VariablePtr equivalentVariable;
  IssuePtr err;
  IssuePtr err_1;
  string componentName;
  ComponentPtr equivalentComponent;
  ComponentPtr component;
  VariablePairPtr pair;
  string local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_298;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  string local_278;
  VariablePtr *local_258;
  long *local_250;
  long local_248;
  long local_240;
  long lStack_238;
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  string local_1f0;
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  long *local_1b0;
  undefined8 local_1a8;
  long local_1a0;
  undefined8 uStack_198;
  string local_190;
  Variable local_170;
  undefined1 local_150 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  string local_128;
  string local_108;
  ValidatorImpl *local_e8;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  element_type *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  ParentedEntityConstPtr local_80;
  ParentedEntityConstPtr local_70;
  string local_60;
  value_type local_40;
  
  local_150._16_8_ = alreadyReported;
  local_e8 = this;
  interfaceTypeMinimumRequired = determineInterfaceType(variable);
  local_2b8._M_dataplus._M_p =
       (pointer)(variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
  local_2b8._M_string_length =
       (size_type)
       (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length)->
           _M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length)->
           _M_use_count + 1;
    }
  }
  owningComponent(&local_70);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length);
  }
  NamedEntity::name_abi_cxx11_
            (&local_108,
             (NamedEntity *)
             local_70.
             super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  local_258 = variable;
  if (interfaceTypeMinimumRequired == NONE) {
    uVar15 = 0;
    while( true ) {
      sVar5 = Variable::equivalentVariableCount
                        ((variable->
                         super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                        );
      if (sVar5 <= uVar15) break;
      Variable::equivalentVariable
                (&local_170,
                 (size_t)(variable->
                         super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                );
      local_2b8._M_dataplus._M_p =
           (pointer)local_170.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity;
      local_2b8._M_string_length =
           (size_type)local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)
           ((long)local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
               *(_Atomic_word *)
                ((long)local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) + 1
          ;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)
           ((long)local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
               *(_Atomic_word *)
                ((long)local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) + 1
          ;
        }
      }
      owningComponent(&local_80);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length);
      }
      if ((local_80.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr != (element_type *)0x0) &&
         (bVar3 = reachableEquivalence(variable,(VariablePtr *)&local_170),
         this_00 = local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl, !bVar3)) {
        __it_00._M_current =
             (((_Vector_base<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
                *)local_150._16_8_)->_M_impl).super__Vector_impl_data._M_start;
        psVar2 = (((_Vector_base<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
                    *)local_150._16_8_)->_M_impl).super__Vector_impl_data._M_finish;
        local_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_170.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity;
        local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)
             ((long)local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
                 *(_Atomic_word *)
                  ((long)local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) +
                 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)
             ((long)local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
                 *(_Atomic_word *)
                  ((long)local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) +
                 1;
          }
        }
        local_288._M_allocated_capacity =
             (size_type)
             (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_288._8_8_ =
             (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count + 1
            ;
          }
        }
        local_298 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity;
        local_290 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)
             ((long)local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
                 *(_Atomic_word *)
                  ((long)local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) +
                 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)
             ((long)local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
                 *(_Atomic_word *)
                  ((long)local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) +
                 1;
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count + 1
            ;
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)
             ((long)local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
                 *(_Atomic_word *)
                  ((long)local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) +
                 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)
             ((long)local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
                 *(_Atomic_word *)
                  ((long)local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) +
                 1;
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count + 1
            ;
          }
        }
        local_278._M_dataplus._M_p =
             (pointer)local_170.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity;
        local_278._M_string_length =
             (size_type)local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)
             ((long)local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
                 *(_Atomic_word *)
                  ((long)local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) +
                 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)
             ((long)local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
                 *(_Atomic_word *)
                  ((long)local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) +
                 1;
          }
        }
        local_278.field_2._M_allocated_capacity = local_288._M_allocated_capacity;
        local_278.field_2._8_8_ = local_288._8_8_;
        local_90 = (element_type *)local_288._M_allocated_capacity;
        local_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count + 1
            ;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
        }
        local_2b8._M_dataplus._M_p = local_278._M_dataplus._M_p;
        local_2b8._M_string_length = local_278._M_string_length;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_278._M_string_length + 8) =
                 *(_Atomic_word *)(local_278._M_string_length + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_278._M_string_length + 8) =
                 *(_Atomic_word *)(local_278._M_string_length + 8) + 1;
          }
        }
        local_2b8.field_2._M_allocated_capacity = local_278.field_2._M_allocated_capacity;
        local_2b8.field_2._8_8_ = local_278.field_2._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278.field_2._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_278.field_2._8_8_ + 8) =
                 *(_Atomic_word *)(local_278.field_2._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_278.field_2._8_8_ + 8) =
                 *(_Atomic_word *)(local_278.field_2._8_8_ + 8) + 1;
          }
        }
        lVar12 = (long)psVar2 - (long)__it_00._M_current >> 6;
        if (0 < lVar12) {
          lVar12 = lVar12 + 1;
          do {
            bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                    ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                  *)&local_2b8,__it_00);
            __it._M_current = __it_00._M_current;
            variable = local_258;
            if (bVar3) goto LAB_00284300;
            bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                    ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                  *)&local_2b8,__it_00._M_current + 1);
            __it._M_current = __it_00._M_current + 1;
            variable = local_258;
            if (bVar3) goto LAB_00284300;
            bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                    ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                  *)&local_2b8,__it_00._M_current + 2);
            __it._M_current = __it_00._M_current + 2;
            variable = local_258;
            if (bVar3) goto LAB_00284300;
            bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                    ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                  *)&local_2b8,__it_00._M_current + 3);
            __it._M_current = __it_00._M_current + 3;
            variable = local_258;
            if (bVar3) goto LAB_00284300;
            __it_00._M_current = __it_00._M_current + 4;
            lVar12 = lVar12 + -1;
          } while (1 < lVar12);
        }
        variable = local_258;
        lVar12 = (long)psVar2 - (long)__it_00._M_current >> 4;
        if (lVar12 == 1) {
LAB_002842ec:
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                  ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                *)&local_2b8,__it_00);
          __it._M_current = psVar2;
          if (bVar3) {
            __it._M_current = __it_00._M_current;
          }
        }
        else {
          __it._M_current = __it_00._M_current;
          if (lVar12 == 2) {
LAB_002842c3:
            bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                    ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                  *)&local_2b8,__it);
            if (!bVar3) {
              __it_00._M_current = __it._M_current + 1;
              goto LAB_002842ec;
            }
          }
          else {
            __it._M_current = psVar2;
            if ((lVar12 == 3) &&
               (bVar3 = __gnu_cxx::__ops::
                        _Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                        ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                      *)&local_2b8,__it_00), __it._M_current = __it_00._M_current,
               !bVar3)) {
              __it._M_current = __it_00._M_current + 1;
              goto LAB_002842c3;
            }
          }
        }
LAB_00284300:
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8.field_2._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8.field_2._8_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278.field_2._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278.field_2._8_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_);
        }
        if (local_290 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_290);
        }
        if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
        }
        if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
        }
        if (__it._M_current ==
            (((_Vector_base<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
               *)local_150._16_8_)->_M_impl).super__Vector_impl_data._M_finish) {
          VariablePair::create((VariablePair *)&local_40,variable,(VariablePtr *)&local_170);
          std::
          vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
          ::push_back((vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
                       *)local_150._16_8_,&local_40);
          NamedEntity::name_abi_cxx11_
                    (&local_2b8,
                     (NamedEntity *)
                     local_80.
                     super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          Issue::IssueImpl::create();
          pIVar1 = *(IssueImpl **)(local_150._24_8_ + 8);
          NamedEntity::name_abi_cxx11_
                    (&local_60,
                     &((variable->
                       super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      ->super_NamedEntity);
          plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x2b6f19);
          plVar8 = plVar6 + 2;
          if ((long *)*plVar6 == plVar8) {
            local_b0 = *plVar8;
            lStack_a8 = plVar6[3];
            local_c0 = &local_b0;
          }
          else {
            local_b0 = *plVar8;
            local_c0 = (long *)*plVar6;
          }
          local_b8 = plVar6[1];
          *plVar6 = (long)plVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_c0);
          local_e0 = &local_d0;
          plVar8 = plVar6 + 2;
          if ((long *)*plVar6 == plVar8) {
            local_d0 = *plVar8;
            lStack_c8 = plVar6[3];
          }
          else {
            local_d0 = *plVar8;
            local_e0 = (long *)*plVar6;
          }
          local_d8 = plVar6[1];
          *plVar6 = (long)plVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_e0,(ulong)local_108._M_dataplus._M_p);
          local_170.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
          super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_150;
          peVar9 = (element_type *)(plVar6 + 2);
          if ((element_type *)*plVar6 == peVar9) {
            local_150._0_8_ =
                 (peVar9->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
            local_150._8_8_ = plVar6[3];
          }
          else {
            local_150._0_8_ =
                 (peVar9->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
            local_170.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
            super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar6;
          }
          local_170.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
          super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[1];
          *plVar6 = (long)peVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append
                                     ((char *)&local_170.
                                               super_enable_shared_from_this<libcellml::Variable>);
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          puVar10 = (ulong *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar10) {
            local_190.field_2._M_allocated_capacity = *puVar10;
            local_190.field_2._8_8_ = plVar6[3];
          }
          else {
            local_190.field_2._M_allocated_capacity = *puVar10;
            local_190._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_190._M_string_length = plVar6[1];
          *plVar6 = (long)puVar10;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          NamedEntity::name_abi_cxx11_
                    (&local_128,
                     (NamedEntity *)
                     local_170.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity);
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            uVar13 = local_190.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_128._M_string_length + local_190._M_string_length) {
            uVar13 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              uVar13 = local_128.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar13 < local_128._M_string_length + local_190._M_string_length)
            goto LAB_0028461c;
            puVar4 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_128,0,(char *)0x0,(ulong)local_190._M_dataplus._M_p);
          }
          else {
LAB_0028461c:
            puVar4 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_190,(ulong)local_128._M_dataplus._M_p);
          }
          local_1b0 = &local_1a0;
          plVar6 = puVar4 + 2;
          if ((long *)*puVar4 == plVar6) {
            local_1a0 = *plVar6;
            uStack_198 = puVar4[3];
          }
          else {
            local_1a0 = *plVar6;
            local_1b0 = (long *)*puVar4;
          }
          local_1a8 = puVar4[1];
          *puVar4 = plVar6;
          puVar4[1] = 0;
          *(undefined1 *)plVar6 = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b0);
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          puVar10 = (ulong *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar10) {
            local_1f0.field_2._M_allocated_capacity = *puVar10;
            local_1f0.field_2._8_8_ = plVar6[3];
          }
          else {
            local_1f0.field_2._M_allocated_capacity = *puVar10;
            local_1f0._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_1f0._M_string_length = plVar6[1];
          *plVar6 = (long)puVar10;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_1f0,(ulong)local_2b8._M_dataplus._M_p);
          local_250 = &local_240;
          plVar8 = plVar6 + 2;
          if ((long *)*plVar6 == plVar8) {
            local_240 = *plVar8;
            lStack_238 = plVar6[3];
          }
          else {
            local_240 = *plVar8;
            local_250 = (long *)*plVar6;
          }
          local_248 = plVar6[1];
          *plVar6 = (long)plVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_250);
          local_230 = &local_220;
          plVar8 = plVar6 + 2;
          if ((long *)*plVar6 == plVar8) {
            local_220 = *plVar8;
            lStack_218 = plVar6[3];
          }
          else {
            local_220 = *plVar8;
            local_230 = (long *)*plVar6;
          }
          local_228 = plVar6[1];
          *plVar6 = (long)plVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_230,(ulong)local_108._M_dataplus._M_p);
          local_1d0 = &local_1c0;
          plVar8 = plVar6 + 2;
          if ((long *)*plVar6 == plVar8) {
            local_1c0 = *plVar8;
            lStack_1b8 = plVar6[3];
          }
          else {
            local_1c0 = *plVar8;
            local_1d0 = (long *)*plVar6;
          }
          local_1c8 = plVar6[1];
          *plVar6 = (long)plVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d0);
          local_210 = &local_200;
          plVar8 = plVar6 + 2;
          if ((long *)*plVar6 == plVar8) {
            local_200 = *plVar8;
            lStack_1f8 = plVar6[3];
          }
          else {
            local_200 = *plVar8;
            local_210 = (long *)*plVar6;
          }
          local_208 = plVar6[1];
          *plVar6 = (long)plVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_210,(ulong)local_2b8._M_dataplus._M_p);
          local_298 = &local_288;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 == paVar11) {
            local_288._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_288._8_8_ = plVar6[3];
          }
          else {
            local_288._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_298 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar6;
          }
          local_290 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[1];
          *plVar6 = (long)paVar11;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_298);
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 == paVar11) {
            local_278.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_278.field_2._8_8_ = plVar6[3];
          }
          else {
            local_278.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_278._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_278._M_string_length = plVar6[1];
          *plVar6 = (long)paVar11;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          Issue::IssueImpl::setDescription(pIVar1,&local_278);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,
                            (ulong)(local_278.field_2._M_allocated_capacity + 1));
          }
          if (local_298 != &local_288) {
            operator_delete(local_298,(ulong)(local_288._M_allocated_capacity + 1));
          }
          if (local_210 != &local_200) {
            operator_delete(local_210,local_200 + 1);
          }
          if (local_1d0 != &local_1c0) {
            operator_delete(local_1d0,local_1c0 + 1);
          }
          if (local_230 != &local_220) {
            operator_delete(local_230,local_220 + 1);
          }
          if (local_250 != &local_240) {
            operator_delete(local_250,local_240 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          if (local_1b0 != &local_1a0) {
            operator_delete(local_1b0,local_1a0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          if (local_170.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
              super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)local_150) {
            operator_delete(local_170.super_enable_shared_from_this<libcellml::Variable>.
                            _M_weak_this.
                            super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            ,local_150._0_8_ + 1);
          }
          if (local_e0 != &local_d0) {
            operator_delete(local_e0,local_d0 + 1);
          }
          if (local_c0 != &local_b0) {
            operator_delete(local_c0,local_b0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          AnyCellmlElement::AnyCellmlElementImpl::setMapVariables
                    ((AnyCellmlElementImpl *)
                     **(undefined8 **)(*(long *)(local_150._24_8_ + 8) + 0x28),variable,
                     (VariablePtr *)&local_170);
          Issue::IssueImpl::setReferenceRule
                    (*(IssueImpl **)(local_150._24_8_ + 8),MAP_VARIABLES_ELEMENT);
          Logger::LoggerImpl::addIssue(&local_e8->super_LoggerImpl,(IssuePtr *)(local_150 + 0x18));
          if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,
                            (ulong)(local_2b8.field_2._M_allocated_capacity + 1));
          }
          if (local_40.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_40.
                       super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
      }
      if (local_80.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.
                   super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_170.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
      }
      uVar15 = uVar15 + 1;
    }
    goto LAB_00285413;
  }
  Variable::interfaceType_abi_cxx11_
            (&local_2b8,
             (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  bVar3 = interfaceTypeIsCompatible(interfaceTypeMinimumRequired,&local_2b8);
  if (!bVar3) {
    Issue::IssueImpl::create();
    pIVar1 = (IssueImpl *)
             ((local_170.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
               super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      NamedEntity::name_abi_cxx11_
                (&local_1f0,
                 &((variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->super_NamedEntity);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,0x29da21);
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_240 = *plVar8;
        lStack_238 = plVar6[3];
        local_250 = &local_240;
      }
      else {
        local_240 = *plVar8;
        local_250 = (long *)*plVar6;
      }
      local_248 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_250);
      local_230 = &local_220;
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_220 = *plVar8;
        lStack_218 = plVar6[3];
      }
      else {
        local_220 = *plVar8;
        local_230 = (long *)*plVar6;
      }
      local_228 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_230,(ulong)local_108._M_dataplus._M_p);
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_1c0 = *plVar8;
        lStack_1b8 = plVar6[3];
        local_1d0 = &local_1c0;
      }
      else {
        local_1c0 = *plVar8;
        local_1d0 = (long *)*plVar6;
      }
      local_1c8 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d0);
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_200 = *plVar8;
        lStack_1f8 = plVar6[3];
        local_210 = &local_200;
      }
      else {
        local_200 = *plVar8;
        local_210 = (long *)*plVar6;
      }
      local_208 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      lVar12 = 0x2fb6f8;
      if (libcellml::interfaceTypeToString_abi_cxx11_._16_8_ != 0) {
        lVar12 = 0x2fb6f8;
        lVar7 = libcellml::interfaceTypeToString_abi_cxx11_._16_8_;
        do {
          if ((int)interfaceTypeMinimumRequired <= *(int *)(lVar7 + 0x20)) {
            lVar12 = lVar7;
          }
          lVar7 = *(long *)(lVar7 + 0x10 +
                           (ulong)(*(int *)(lVar7 + 0x20) < (int)interfaceTypeMinimumRequired) * 8);
        } while (lVar7 != 0);
      }
      lVar7 = 0x2fb6f8;
      if ((lVar12 != 0x2fb6f8) &&
         (lVar7 = 0x2fb6f8, *(int *)(lVar12 + 0x20) <= (int)interfaceTypeMinimumRequired)) {
        lVar7 = lVar12;
      }
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_210,*(ulong *)(lVar7 + 0x28));
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar11) {
        local_288._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_288._8_8_ = plVar6[3];
        local_298 = &local_288;
      }
      else {
        local_288._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_298 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar6;
      }
      local_290 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[1];
      *plVar6 = (long)paVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_298);
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar11) {
        local_278.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_278.field_2._8_8_ = plVar6[3];
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      }
      else {
        local_278.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_278._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_278._M_string_length = plVar6[1];
      *plVar6 = (long)paVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      Issue::IssueImpl::setDescription(pIVar1,&local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,
                        (ulong)(local_278.field_2._M_allocated_capacity + 1));
      }
      if (local_298 != &local_288) {
        operator_delete(local_298,(ulong)(local_288._M_allocated_capacity + 1));
      }
      if (local_210 != &local_200) {
        operator_delete(local_210,local_200 + 1);
      }
      variable_00 = local_258;
      if (local_1d0 != &local_1c0) {
        operator_delete(local_1d0,local_1c0 + 1);
      }
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      if (local_250 != &local_240) {
        operator_delete(local_250,local_240 + 1);
      }
      uVar13 = local_1f0.field_2._M_allocated_capacity;
      _Var14._M_p = local_1f0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) goto LAB_00285398;
    }
    else {
      NamedEntity::name_abi_cxx11_
                (&local_190,
                 &((variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->super_NamedEntity);
      puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,0x29da21)
      ;
      local_1b0 = &local_1a0;
      plVar6 = puVar4 + 2;
      if ((long *)*puVar4 == plVar6) {
        local_1a0 = *plVar6;
        uStack_198 = puVar4[3];
      }
      else {
        local_1a0 = *plVar6;
        local_1b0 = (long *)*puVar4;
      }
      local_1a8 = puVar4[1];
      *puVar4 = plVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b0);
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      puVar10 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_1f0.field_2._M_allocated_capacity = *puVar10;
        local_1f0.field_2._8_8_ = plVar6[3];
      }
      else {
        local_1f0.field_2._M_allocated_capacity = *puVar10;
        local_1f0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_1f0._M_string_length = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_1f0,(ulong)local_108._M_dataplus._M_p);
      local_250 = &local_240;
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_240 = *plVar8;
        lStack_238 = plVar6[3];
      }
      else {
        local_240 = *plVar8;
        local_250 = (long *)*plVar6;
      }
      local_248 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_250);
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_220 = *plVar8;
        lStack_218 = plVar6[3];
        local_230 = &local_220;
      }
      else {
        local_220 = *plVar8;
        local_230 = (long *)*plVar6;
      }
      local_228 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_230,(ulong)local_2b8._M_dataplus._M_p);
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_1c0 = *plVar8;
        lStack_1b8 = plVar6[3];
        local_1d0 = &local_1c0;
      }
      else {
        local_1c0 = *plVar8;
        local_1d0 = (long *)*plVar6;
      }
      local_1c8 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d0);
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_200 = *plVar8;
        lStack_1f8 = plVar6[3];
        local_210 = &local_200;
      }
      else {
        local_200 = *plVar8;
        local_210 = (long *)*plVar6;
      }
      local_208 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      lVar12 = 0x2fb6f8;
      if (libcellml::interfaceTypeToString_abi_cxx11_._16_8_ != 0) {
        lVar12 = 0x2fb6f8;
        lVar7 = libcellml::interfaceTypeToString_abi_cxx11_._16_8_;
        do {
          if ((int)interfaceTypeMinimumRequired <= *(int *)(lVar7 + 0x20)) {
            lVar12 = lVar7;
          }
          lVar7 = *(long *)(lVar7 + 0x10 +
                           (ulong)(*(int *)(lVar7 + 0x20) < (int)interfaceTypeMinimumRequired) * 8);
        } while (lVar7 != 0);
      }
      lVar7 = 0x2fb6f8;
      if ((lVar12 != 0x2fb6f8) &&
         (lVar7 = 0x2fb6f8, *(int *)(lVar12 + 0x20) <= (int)interfaceTypeMinimumRequired)) {
        lVar7 = lVar12;
      }
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_210,*(ulong *)(lVar7 + 0x28));
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar11) {
        local_288._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_288._8_8_ = plVar6[3];
        local_298 = &local_288;
      }
      else {
        local_288._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_298 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar6;
      }
      local_290 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[1];
      *plVar6 = (long)paVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_298);
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar11) {
        local_278.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_278.field_2._8_8_ = plVar6[3];
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      }
      else {
        local_278.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_278._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_278._M_string_length = plVar6[1];
      *plVar6 = (long)paVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      Issue::IssueImpl::setDescription(pIVar1,&local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,
                        (ulong)(local_278.field_2._M_allocated_capacity + 1));
      }
      if (local_298 != &local_288) {
        operator_delete(local_298,(ulong)(local_288._M_allocated_capacity + 1));
      }
      if (local_210 != &local_200) {
        operator_delete(local_210,local_200 + 1);
      }
      if (local_1d0 != &local_1c0) {
        operator_delete(local_1d0,local_1c0 + 1);
      }
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      variable_00 = local_258;
      if (local_250 != &local_240) {
        operator_delete(local_250,local_240 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if (local_1b0 != &local_1a0) {
        operator_delete(local_1b0,local_1a0 + 1);
      }
      uVar13 = local_190.field_2._M_allocated_capacity;
      _Var14._M_p = local_190._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
LAB_00285398:
        operator_delete(_Var14._M_p,uVar13 + 1);
      }
    }
    AnyCellmlElement::AnyCellmlElementImpl::setVariable
              (*(AnyCellmlElementImpl **)
                ((local_170.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                  super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl[1].mId._M_string_length,
               variable_00);
    Issue::IssueImpl::setReferenceRule
              ((IssueImpl *)
               ((local_170.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                 super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,MAP_VARIABLES_ELEMENT);
    Logger::LoggerImpl::addIssue
              (&local_e8->super_LoggerImpl,
               (IssuePtr *)&local_170.super_enable_shared_from_this<libcellml::Variable>);
    if (local_170.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
        super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_170.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                 super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,(ulong)(local_2b8.field_2._M_allocated_capacity + 1))
    ;
  }
LAB_00285413:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if (local_70.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.
               super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void Validator::ValidatorImpl::validateVariableInterface(const VariablePtr &variable, VariableMap &alreadyReported)
{
    Variable::InterfaceType interfaceType = determineInterfaceType(variable);
    auto component = owningComponent(variable);
    std::string componentName = component->name();
    if (interfaceType == Variable::InterfaceType::NONE) {
        for (size_t index = 0; index < variable->equivalentVariableCount(); ++index) {
            const auto equivalentVariable = variable->equivalentVariable(index);
            auto equivalentComponent = owningComponent(equivalentVariable);
            if (equivalentComponent != nullptr && !reachableEquivalence(variable, equivalentVariable)) {
                auto it = std::find_if(alreadyReported.begin(), alreadyReported.end(),
                                       [equivalentVariable, variable](const VariablePairPtr &in) {
                                           return (in->variable1() == equivalentVariable) && (in->variable2() == variable);
                                       });
                if (it == alreadyReported.end()) {
                    VariablePairPtr pair = VariablePair::create(variable, equivalentVariable);
                    alreadyReported.push_back(pair);
                    std::string equivalentComponentName = equivalentComponent->name();

                    IssuePtr err = Issue::IssueImpl::create();
                    err->mPimpl->setDescription("The equivalence between '" + variable->name() + "' in component '" + componentName + "'  and '" + equivalentVariable->name() + "' in component '" + equivalentComponentName + "' is invalid. Component '" + componentName + "' and '" + equivalentComponentName + "' are neither siblings nor in a parent/child relationship.");
                    err->mPimpl->mItem->mPimpl->setMapVariables(variable, equivalentVariable);
                    err->mPimpl->setReferenceRule(Issue::ReferenceRule::MAP_VARIABLES_ELEMENT);
                    addIssue(err);
                }
            }
        }
    } else {
        auto interfaceTypeString = variable->interfaceType();
        if (!interfaceTypeIsCompatible(interfaceType, interfaceTypeString)) {
            IssuePtr err = Issue::IssueImpl::create();
            if (interfaceTypeString.empty()) {
                err->mPimpl->setDescription("Variable '" + variable->name() + "' in component '" + componentName + "' has no interface type set. The interface type required is '" + interfaceTypeToString.find(interfaceType)->second + "'.");
            } else {
                err->mPimpl->setDescription("Variable '" + variable->name() + "' in component '" + componentName + "' has an interface type set to '" + interfaceTypeString + "' which is not the correct interface type for this variable. The interface type required is '" + interfaceTypeToString.find(interfaceType)->second + "'.");
            }
            err->mPimpl->mItem->mPimpl->setVariable(variable);
            err->mPimpl->setReferenceRule(Issue::ReferenceRule::MAP_VARIABLES_ELEMENT);
            addIssue(err);
        }
    }
}